

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib575.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  undefined8 uVar8;
  timeval tVar9;
  undefined8 uStack_1d0;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  
  still_running = 0;
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                  ,0x30,iVar1,uVar2);
    goto LAB_00102419;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                  ,0x32);
    iVar1 = 0x7c;
    lVar4 = 0;
    goto LAB_00102404;
  }
  iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
  uVar8 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_setopt(lVar3,0xc5,1);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      uStack_1d0 = 0x35;
      goto LAB_001023f0;
    }
    iVar1 = curl_easy_setopt(lVar3,0x29,1);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      uStack_1d0 = 0x36;
      goto LAB_001023f0;
    }
    iVar1 = curl_easy_perform(lVar3);
    if (iVar1 != 0) goto LAB_00102401;
    iVar1 = curl_easy_perform(lVar3);
    if (iVar1 != 0) goto LAB_00102401;
    lVar4 = curl_easy_duphandle(lVar3);
    if (lVar4 == 0) {
      iVar1 = 0;
      goto LAB_00102401;
    }
    curl_easy_cleanup(lVar3);
    lVar5 = curl_multi_init();
    if (lVar5 == 0) {
      lVar5 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                    ,0x46);
      iVar1 = 0x7b;
    }
    else {
      iVar1 = curl_multi_add_handle(lVar5,lVar4);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_multi_perform(lVar5,&still_running);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          if (still_running < 0) {
            pcVar7 = 
            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
            ;
            uStack_1d0 = 0x4a;
LAB_001026b8:
            curl_mfprintf(_stderr,pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                          ,uStack_1d0);
            iVar1 = 0x7a;
          }
          else {
            tVar9 = tutil_tvnow();
            lVar3 = tutil_tvdiff(tVar9,tv_test_start);
            if (lVar3 < 0xea61) {
              if (still_running == 0) {
                iVar1 = 0;
              }
              else {
                do {
                  timeout.tv_sec = 0;
                  maxfd = -99;
                  timeout.tv_usec = 100000;
                  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                    fdread.__fds_bits[lVar3] = 0;
                  }
                  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                    fdwrite.__fds_bits[lVar3] = 0;
                  }
                  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                    fdexcep.__fds_bits[lVar3] = 0;
                  }
                  iVar1 = curl_multi_fdset(lVar5,&fdread,&fdwrite,&fdexcep,&maxfd);
                  uVar8 = _stderr;
                  if (iVar1 != 0) {
                    uVar2 = curl_multi_strerror(iVar1);
                    pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                    uStack_1d0 = 0x5c;
                    goto LAB_0010250f;
                  }
                  if (maxfd < -1) {
                    pcVar7 = 
                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
                    uStack_1d0 = 0x5c;
                    goto LAB_001026b8;
                  }
                  iVar1 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
                  if (iVar1 == -1) {
                    piVar6 = __errno_location();
                    uVar8 = _stderr;
                    iVar1 = *piVar6;
                    pcVar7 = strerror(iVar1);
                    curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                                  ,0x60,iVar1,pcVar7);
                    iVar1 = 0x79;
                    break;
                  }
                  tVar9 = tutil_tvnow();
                  lVar3 = tutil_tvdiff(tVar9,tv_test_start);
                  if (60000 < lVar3) {
                    uStack_1d0 = 0x62;
                    goto LAB_001026e1;
                  }
                  iVar1 = curl_multi_perform(lVar5,&still_running);
                  uVar8 = _stderr;
                  if (iVar1 != 0) {
                    uVar2 = curl_multi_strerror(iVar1);
                    pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                    uStack_1d0 = 100;
                    goto LAB_0010250f;
                  }
                  if (still_running < 0) {
                    pcVar7 = 
                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                    ;
                    uStack_1d0 = 100;
                    goto LAB_001026b8;
                  }
                  tVar9 = tutil_tvnow();
                  lVar3 = tutil_tvdiff(tVar9,tv_test_start);
                  if (60000 < lVar3) {
                    uStack_1d0 = 0x66;
                    goto LAB_001026e1;
                  }
                  iVar1 = 0;
                } while (still_running != 0);
              }
            }
            else {
              uStack_1d0 = 0x4c;
LAB_001026e1:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                            ,uStack_1d0);
              iVar1 = 0x7d;
            }
          }
          goto LAB_00102404;
        }
        uVar2 = curl_multi_strerror(iVar1);
        pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uStack_1d0 = 0x4a;
      }
      else {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_1d0 = 0x48;
      }
LAB_0010250f:
      curl_mfprintf(uVar8,pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                    ,uStack_1d0,iVar1,uVar2);
    }
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    uStack_1d0 = 0x34;
LAB_001023f0:
    curl_mfprintf(uVar8,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib575.c"
                  ,uStack_1d0,iVar1,uVar2);
LAB_00102401:
    lVar5 = 0;
    lVar4 = lVar3;
  }
LAB_00102404:
  curl_multi_cleanup(lVar5);
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
LAB_00102419:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURL *duphandle = NULL;
  CURLM *mhandle = NULL;
  int res = 0;
  int still_running = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(handle);

  easy_setopt(handle, CURLOPT_URL, URL);
  easy_setopt(handle, CURLOPT_WILDCARDMATCH, 1L);
  easy_setopt(handle, CURLOPT_VERBOSE, 1L);

  res = curl_easy_perform(handle);
  if(res)
    goto test_cleanup;

  res = curl_easy_perform(handle);
  if(res)
    goto test_cleanup;

  duphandle = curl_easy_duphandle(handle);
  if(!duphandle)
    goto test_cleanup;
  curl_easy_cleanup(handle);
  handle = duphandle;

  multi_init(mhandle);

  multi_add_handle(mhandle, handle);

  multi_perform(mhandle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(mhandle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(mhandle, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(mhandle);
  curl_easy_cleanup(handle);
  curl_global_cleanup();

  return res;
}